

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_log(int iErrCode,char *zFormat,...)

{
  _func_void_void_ptr_int_char_ptr *p_Var1;
  void *pvVar2;
  char in_AL;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char zMsg [210];
  __va_list_tag local_1e8;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  sqlite3_str local_118;
  char local_f8 [216];
  
  if (in_AL != '\0') {
    local_198 = in_XMM0_Qa;
    local_188 = in_XMM1_Qa;
    local_178 = in_XMM2_Qa;
    local_168 = in_XMM3_Qa;
    local_158 = in_XMM4_Qa;
    local_148 = in_XMM5_Qa;
    local_138 = in_XMM6_Qa;
    local_128 = in_XMM7_Qa;
  }
  if (sqlite3Config.xLog != (_func_void_void_ptr_int_char_ptr *)0x0) {
    local_1e8.reg_save_area = local_1c8;
    local_1e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_1e8.gp_offset = 0x10;
    local_1e8.fp_offset = 0x30;
    local_118.zText = local_f8;
    local_118.db = (sqlite3 *)0x0;
    local_118.nAlloc = 0xd2;
    local_118.mxAlloc = 0;
    local_118.nChar = 0;
    local_118.accError = '\0';
    local_118.printfFlags = '\0';
    local_1b8 = in_RDX;
    local_1b0 = in_RCX;
    local_1a8 = in_R8;
    local_1a0 = in_R9;
    sqlite3_str_vappendf(&local_118,zFormat,&local_1e8);
    pvVar2 = sqlite3Config.pLogArg;
    p_Var1 = sqlite3Config.xLog;
    pcVar3 = sqlite3StrAccumFinish(&local_118);
    (*p_Var1)(pvVar2,iErrCode,pcVar3);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_log(int iErrCode, const char *zFormat, ...){
  va_list ap;                             /* Vararg list */
  if( sqlite3GlobalConfig.xLog ){
    va_start(ap, zFormat);
    renderLogMsg(iErrCode, zFormat, ap);
    va_end(ap);
  }
}